

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O2

ssize_t __thiscall QRfbServerInit::write(QRfbServerInit *this,int __fd,void *__buf,size_t __n)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  char *pcVar3;
  long in_FS_OFFSET;
  uint local_30;
  quint16 t;
  long local_28;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  t = this->width << 8 | this->width >> 8;
  QIODevice::write(pcVar3,(longlong)&t);
  t = this->height << 8 | this->height >> 8;
  QIODevice::write(pcVar3,(longlong)&t);
  QRfbPixelFormat::write(&this->format,__fd,__buf_00,__n);
  sVar2 = strlen(this->name);
  uVar1 = (uint)sVar2;
  local_30 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  QIODevice::write(pcVar3,(longlong)&local_30);
  __s = this->name;
  strlen(__s);
  QIODevice::write(pcVar3,(longlong)__s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QRfbServerInit::write(QTcpSocket *s)
{
    quint16 t = htons(width);
    s->write(reinterpret_cast<char *>(&t), 2);
    t = htons(height);
    s->write(reinterpret_cast<char *>(&t), 2);
    format.write(s);
    quint32 len = static_cast<quint32>(strlen(name));
    len = htonl(len);
    s->write(reinterpret_cast<char *>(&len), 4);
    s->write(name, static_cast<qint64>(strlen(name)));
}